

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O2

bool __thiscall
duckdb::PerfectHashJoinExecutor::CanDoPerfectHashJoin
          (PerfectHashJoinExecutor *this,PhysicalHashJoin *op,Value *min,Value *max)

{
  Value *this_00;
  vector<duckdb::JoinCondition,_true> *this_01;
  bool bVar1;
  LogicalType *type;
  const_reference pvVar2;
  pointer pEVar3;
  const_reference pvVar4;
  pointer pLVar5;
  unsigned_long uVar6;
  idx_t iVar7;
  int64_t extraout_RDX;
  hugeint_t val;
  hugeint_t build_range;
  hugeint_t max_value;
  hugeint_t min_value;
  LogicalType key_type;
  Value local_c0;
  hugeint_t local_80;
  Value local_70;
  
  if ((this->perfect_join_statistics).is_build_small != false) {
    return true;
  }
  this_01 = &(op->super_PhysicalComparisonJoin).conditions;
  bVar1 = false;
  pvVar2 = vector<duckdb::JoinCondition,_true>::get<true>(this_01,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&pvVar2->left);
  LogicalType::LogicalType(&key_type,&pEVar3->return_type);
  if ((op->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.field_0x81
      == '\x03') {
    if ((((long)(op->super_PhysicalComparisonJoin).conditions.
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(op->super_PhysicalComparisonJoin).conditions.
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x18) &&
        (pvVar2 = vector<duckdb::JoinCondition,_true>::get<true>(this_01,0),
        pvVar2->comparison == COMPARE_BOUNDARY_START)) &&
       (bVar1 = TypeIsInteger(key_type.physical_type_), bVar1)) {
      pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                         (&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                           super_CachingPhysicalOperator.super_PhysicalOperator.children,1);
      for (pLVar5 = (pvVar4->_M_data->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pLVar5 != (pvVar4->_M_data->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pLVar5 = pLVar5 + 1) {
        if ((pLVar5->physical_type_ < 0x1e) &&
           ((0x21800000U >> (pLVar5->physical_type_ & 0x1f) & 1) != 0)) goto LAB_019d903c;
      }
      Value::operator=(&(this->perfect_join_statistics).build_min,min);
      this_00 = &(this->perfect_join_statistics).build_max;
      Value::operator=(this_00,max);
      Value::Value(&local_c0,&(this->perfect_join_statistics).build_min);
      bVar1 = ExtractNumericValue(&local_c0,&min_value);
      if (bVar1) {
        Value::Value(&local_70,this_00);
        bVar1 = ExtractNumericValue(&local_70,&max_value);
        Value::~Value(&local_70);
        Value::~Value(&local_c0);
        if (((bVar1) && (bVar1 = hugeint_t::operator<(&max_value,&min_value), !bVar1)) &&
           (bVar1 = TrySubtractOperator::
                    Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                              (max_value,min_value,&build_range), bVar1)) {
          local_80 = Hugeint::Convert<unsigned_long>(0x100000);
          bVar1 = hugeint_t::operator>(&build_range,&local_80);
          if (!bVar1) {
            val.upper = extraout_RDX;
            val.lower = build_range.upper;
            uVar6 = NumericCastImpl<unsigned_long,_duckdb::hugeint_t,_false>::Convert
                              ((NumericCastImpl<unsigned_long,_duckdb::hugeint_t,_false> *)
                               build_range.lower,val);
            (this->perfect_join_statistics).build_range = uVar6;
            iVar7 = JoinHashTable::Count(this->ht);
            if (iVar7 <= (this->perfect_join_statistics).build_range) {
              (this->perfect_join_statistics).is_build_small = true;
              bVar1 = true;
              goto LAB_019d903f;
            }
          }
        }
      }
      else {
        Value::~Value(&local_c0);
      }
    }
LAB_019d903c:
    bVar1 = false;
  }
LAB_019d903f:
  LogicalType::~LogicalType(&key_type);
  return bVar1;
}

Assistant:

bool PerfectHashJoinExecutor::CanDoPerfectHashJoin(const PhysicalHashJoin &op, const Value &min, const Value &max) {
	if (perfect_join_statistics.is_build_small) {
		return true; // Already true based on static statistics
	}

	// We only do this optimization for inner joins with one integer equality condition
	const auto key_type = op.conditions[0].left->return_type;
	if (op.join_type != JoinType::INNER || op.conditions.size() != 1 ||
	    op.conditions[0].comparison != ExpressionType::COMPARE_EQUAL || !TypeIsInteger(key_type.InternalType())) {
		return false;
	}

	// We bail out if there are nested types on the RHS
	for (auto &type : op.children[1].get().GetTypes()) {
		switch (type.InternalType()) {
		case PhysicalType::STRUCT:
		case PhysicalType::LIST:
		case PhysicalType::ARRAY:
			return false;
		default:
			break;
		}
	}

	// And when the build range is smaller than the threshold
	perfect_join_statistics.build_min = min;
	perfect_join_statistics.build_max = max;
	hugeint_t min_value, max_value;
	if (!ExtractNumericValue(perfect_join_statistics.build_min, min_value) ||
	    !ExtractNumericValue(perfect_join_statistics.build_max, max_value)) {
		return false;
	}
	if (max_value < min_value) {
		return false; // Empty table
	}

	hugeint_t build_range;
	if (!TrySubtractOperator::Operation(max_value, min_value, build_range)) {
		return false;
	}

	// The max size our build must have to run the perfect HJ
	static constexpr idx_t MAX_BUILD_SIZE = 1048576;
	if (build_range > Hugeint::Convert(MAX_BUILD_SIZE)) {
		return false;
	}
	perfect_join_statistics.build_range = NumericCast<idx_t>(build_range);

	// If count is larger than range (duplicates), we bail out
	if (ht.Count() > perfect_join_statistics.build_range) {
		return false;
	}

	perfect_join_statistics.is_build_small = true;
	return true;
}